

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

TWordId __thiscall NJamSpell::TLangModel::GetWordId(TLangModel *this,TWord *word)

{
  robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *key;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer *pppbVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  iterator __position;
  size_t hash;
  const_iterator cVar5;
  TWordId TVar6;
  long local_88 [2];
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
  local_78;
  undefined1 local_50 [8];
  wstring w;
  
  pwVar3 = word->Ptr;
  if ((pwVar3 != (wchar_t *)0x0) && (uVar4 = word->Len, uVar4 != 0)) {
    if (uVar4 < 10000) {
      local_50 = (undefined1  [8])&w._M_string_length;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_50,pwVar3,pwVar3 + uVar4)
      ;
      key = &(this->WordToId).
             super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
      ;
      hash = std::
             hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator()((hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                           *)key,(wstring *)local_50);
      cVar5 = tsl::detail_robin_hash::
              robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              ::find_impl<std::__cxx11::wstring>
                        ((robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                          *)key,(wstring *)local_50,hash);
      if (cVar5.m_iterator._M_current ==
          (iterator_bucket)
          *(pointer *)
           ((long)&(this->WordToId).
                   super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   .m_ht.m_buckets.
                   super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
                   ._M_impl.super__Vector_impl_data + 8)) {
        TVar6 = this->LastWordID;
        this->LastWordID = TVar6 + 1;
        paVar1 = &local_78.first.field_2;
        local_78.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_78,local_50,(pointer)((long)local_50 + w._M_dataplus._M_p * 4))
        ;
        local_78.second = TVar6;
        tsl::detail_robin_hash::
        robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
        ::insert_impl<std::__cxx11::wstring,std::pair<std::__cxx11::wstring,unsigned_int>>
                  ((robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    *)local_88,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)key
                   ,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_78.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_78.first._M_dataplus._M_p);
        }
        local_78.first._M_dataplus._M_p = (pointer)(local_88[0] + 8);
        __position._M_current =
             (this->IdToWord).
             super__Vector_base<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::allocator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->IdToWord).
            super__Vector_base<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::allocator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::__cxx11::wstring_const*,std::allocator<std::__cxx11::wstring_const*>>::
          _M_realloc_insert<std::__cxx11::wstring_const*>
                    ((vector<std::__cxx11::wstring_const*,std::allocator<std::__cxx11::wstring_const*>>
                      *)&this->IdToWord,__position,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> **)
                     &local_78);
        }
        else {
          *__position._M_current =
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_78.first._M_dataplus._M_p;
          pppbVar2 = &(this->IdToWord).
                      super__Vector_base<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::allocator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppbVar2 = *pppbVar2 + 1;
        }
      }
      else {
        TVar6 = *(TWordId *)((long)cVar5.m_iterator._M_current + 0x28);
      }
      if (local_50 != (undefined1  [8])&w._M_string_length) {
        operator_delete((void *)local_50);
      }
      return TVar6;
    }
    __assert_fail("word.Len < 10000",
                  "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/lang_model.cpp"
                  ,0x12a,"TWordId NJamSpell::TLangModel::GetWordId(const TWord &)");
  }
  __assert_fail("word.Ptr && word.Len",
                "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/lang_model.cpp"
                ,0x129,"TWordId NJamSpell::TLangModel::GetWordId(const TWord &)");
}

Assistant:

TWordId TLangModel::GetWordId(const TWord& word) {
    assert(word.Ptr && word.Len);
    assert(word.Len < 10000);
    std::wstring w(word.Ptr, word.Len);
    auto it = WordToId.find(w);
    if (it != WordToId.end()) {
        return it->second;
    }
    TWordId wordId = LastWordID;
    ++LastWordID;
    it = WordToId.insert(std::make_pair(w, wordId)).first;
    IdToWord.push_back(&(it->first));
    return wordId;
}